

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

int __thiscall
ON_TextureMapping::Evaluate
          (ON_TextureMapping *this,ON_3dPoint *P,ON_3dVector *N,ON_3dPoint *T,ON_Xform *P_xform,
          ON_Xform *N_xform)

{
  int iVar1;
  _func_int **pp_Var2;
  ON_3dPoint Q;
  ON_3dVector V;
  ON_3dPoint OStack_58;
  ON_3dVector local_40;
  
  ON_Xform::operator*(&OStack_58,P_xform,P);
  if (this->m_projection == ray_projection) {
    ON_Xform::operator*(&local_40,N_xform,N);
    ON_3dVector::Unitize(&local_40);
    pp_Var2 = (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object;
    N = &local_40;
  }
  else {
    pp_Var2 = (this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object;
  }
  iVar1 = (*pp_Var2[0x18])(this,&OStack_58,N,T);
  return iVar1;
}

Assistant:

int ON_TextureMapping::Evaluate(
        const ON_3dPoint& P,
        const ON_3dVector& N,
        ON_3dPoint* T,
        const ON_Xform& P_xform,
        const ON_Xform& N_xform
        ) const
{
  int rc;
  ON_3dPoint Q = P_xform*P;
  if ( ON_TextureMapping::PROJECTION::ray_projection == m_projection )
  {
    // need a transformed normal
    ON_3dVector V = N_xform*N;
    V.Unitize();
    rc = Evaluate(Q,V,T);
  }
  else
  {
    // normal is ignored
    rc = Evaluate(Q,N,T);
  }
  return rc;
}